

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

py_func_sig_info
boost::python::detail::caller_arity<2U>::
impl<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::python::default_call_policies,_boost::mpl::vector3<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::signature(void)

{
  py_func_sig_info pVar1;
  
  pVar1.signature =
       signature_arity<2U>::
       impl<boost::mpl::vector3<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::elements();
  pVar1.ret = &signature::ret;
  return pVar1;
}

Assistant:

static py_func_sig_info  signature()
        {
            const signature_element * sig = detail::signature<Sig>::elements();
#ifndef BOOST_PYTHON_NO_PY_SIGNATURES

            typedef BOOST_DEDUCED_TYPENAME Policies::template extract_return_type<Sig>::type rtype;
            typedef typename select_result_converter<Policies, rtype>::type result_converter;

            static const signature_element ret = {
                (is_void<rtype>::value ? "void" : type_id<rtype>().name())
                , &detail::converter_target_type<result_converter>::get_pytype
                , boost::detail::indirect_traits::is_reference_to_non_const<rtype>::value 
            };
            py_func_sig_info res = {sig, &ret };
#else
            py_func_sig_info res = {sig, sig };
#endif

            return  res;
        }